

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void send_thread(int sockfd)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ssize_t sVar6;
  WINDOW *win;
  packet *__buf;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  ushort uVar11;
  id iStack_c8;
  id iStack_c0;
  thread tStack_b8;
  _func_void_int *p_Stack_b0;
  sockaddr sStack_a8;
  ulong uStack_98;
  mutex *pmStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  code *pcStack_78;
  ulong uStack_68;
  char *pcStack_60;
  char *pcStack_58;
  char *pcStack_50;
  mutex *pmStack_48;
  code *pcStack_40;
  
  uVar7 = 1;
  do {
    pcStack_40 = (code *)0x102701;
    wclear(typewin);
    pcStack_40 = (code *)0x102714;
    wattr_on(typewin,0x6600,0);
    pcStack_40 = (code *)0x102724;
    iVar2 = wmove(typewin,0,0);
    if (iVar2 != -1) {
      pcStack_40 = (code *)0x10273e;
      whline(typewin,0x20,ncolums);
    }
    pcStack_40 = (code *)0x102760;
    mvwprintw(typewin,0,ncolums + -10,"0/%d",1000);
    pcStack_40 = (code *)0x102773;
    wattr_off(typewin,0x6600,0);
    pcStack_40 = (code *)0x10277b;
    std::mutex::lock(&mutwin);
    pcStack_40 = (code *)0x102790;
    mvwprintw(typewin,1,0,">> ");
    pcStack_40 = (code *)0x10279c;
    wrefresh(typewin);
    pcStack_40 = (code *)0x1027a4;
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
    pcStack_40 = (code *)0x1027b3;
    memset(msg,0,1000);
    pcStack_40 = (code *)0x1027c9;
    input(typewin,msg,1000,true);
    pcStack_40 = (code *)0x1027d1;
    sVar5 = strlen(msg);
    pcStack_40 = (code *)0x1027e0;
    sVar6 = send(sockfd,msg,sVar5,0);
  } while (1 < (int)sVar6 + 1U);
  pcVar8 = "Erro ao enviar mensagem";
  pcStack_40 = (code *)0x1027f9;
  printf("Erro ao enviar mensagem");
  pcStack_40 = rcv_thread;
  exit_();
  pcStack_40 = (code *)0x1;
  pmStack_48 = &mutwin;
  pcStack_50 = "0/%d";
  pcStack_58 = msg;
  pcStack_60 = ">> ";
  pcStack_78 = (code *)0x102815;
  uStack_68 = (ulong)(uint)sockfd;
  pckt = (packet *)malloc(0x406);
  while( true ) {
    __buf = pckt;
    pcStack_78 = (code *)0x10283f;
    memset(pckt,0,0x406);
    pcStack_78 = (code *)0x102850;
    sVar6 = recv((int)pcVar8,__buf,0x406,0);
    if ((int)sVar6 + 1U < 2) break;
    uVar7 = 0xffffffff;
    iVar2 = -1;
    if (typewin != (WINDOW *)0x0) {
      uVar7 = (ulong)(uint)(int)typewin->_cury;
      iVar2 = (int)typewin->_curx;
    }
    pcStack_78 = (code *)0x102894;
    wattr_on(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    pcStack_78 = (code *)0x1028b0;
    wprintw(chatwin,"%s: ",pckt);
    pcStack_78 = (code *)0x1028cf;
    wattr_off(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    pcStack_78 = (code *)0x1028ef;
    wprintw(chatwin,"%s\n",pckt->msg);
    pcStack_78 = (code *)0x1028f7;
    std::mutex::lock(&mutwin);
    pcStack_78 = (code *)0x102903;
    wrefresh(chatwin);
    pcStack_78 = (code *)0x10290f;
    wrefresh(typewin);
    pcStack_78 = (code *)0x102920;
    wmove(typewin,uVar7,iVar2);
    pcStack_78 = (code *)0x102928;
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
  }
  pcVar9 = "Erro ao receber mensagem\n";
  pcStack_78 = (code *)0x102940;
  perror("Erro ao receber mensagem\n");
  pcStack_78 = main;
  exit_();
  uStack_80 = 0xffff;
  uStack_88 = 0xffffffffffffffff;
  pmStack_90 = &mutwin;
  iStack_c0._M_thread = 0;
  iStack_c8._M_thread = 0;
  uVar10 = 0;
  uVar1 = 0;
  uStack_98 = (ulong)pcVar8 & 0xffffffff;
  pcStack_78 = (code *)uVar7;
  if (0 < (int)pcVar9) {
    uVar10 = (ulong)pcVar9 & 0xffffffff;
  }
  do {
    uVar7 = uVar1;
    if (uVar10 == uVar7) {
      uVar3 = 0x15e0;
      goto LAB_001029b4;
    }
    iVar2 = strcmp(*(char **)(__buf->name + uVar7 * 8),"--port");
    uVar1 = uVar7 + 1;
  } while (iVar2 != 0);
  uVar3 = atoi(*(char **)(__buf->name + uVar7 * 8 + 8));
  printf("porta: %d\n",(ulong)(uint)(int)(short)uVar3);
LAB_001029b4:
  uVar11 = (ushort)uVar3;
  initscr();
  cbreak();
  noecho();
  start_color();
  init_colors();
  init_color(0,0,0,0);
  init_pair(0x65,7,0);
  init_pair(0x66,0,7);
  wbkgd(_stdscr,0x6500);
  if (_stdscr == 0) {
    uVar7 = 0xfffffffffffffffa;
    nlines = -1;
    ncolums = -1;
  }
  else {
    nlines = *(short *)(_stdscr + 4) + 1;
    ncolums = *(short *)(_stdscr + 6) + 1;
    uVar7 = (ulong)((int)*(short *)(_stdscr + 4) - 4);
  }
  chatwin = (WINDOW *)newwin(uVar7,ncolums,0,0);
  scrollok(chatwin,1);
  typewin = (WINDOW *)newwin(5,ncolums,nlines + -5,0);
  keypad(typewin,1);
  win = (WINDOW *)newwin(5,0x1c,nlines / 2 + -2,(long)(ncolums + -0x1c) / 2 & 0xffffffff);
  keypad(win,1);
  wbkgd(chatwin,0x6500);
  wbkgd(typewin,0x6500);
  wbkgd(win,0x6500);
  wattr_on(win,0x200000,0);
  wattr_on(chatwin,0x200000,0);
  if (win == (WINDOW *)0x0) {
    iVar2 = -9;
  }
  else {
    iVar2 = (win->_maxx + 1) / 2 + -9;
  }
  box(win,_DAT_00106238,_DAT_0010621c);
  mvwprintw(win,1,iVar2);
  iVar2 = wmove(win,3,2);
  if (iVar2 != -1) {
    whline(win,0x20,0x18);
  }
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  input(win,name,0x18,false);
  delwin(win);
  wrefresh(typewin);
  wrefresh(chatwin);
  ::sockfd = socket(2,1,0);
  if (::sockfd != -1) goto LAB_00102be7;
  perror("Erro ao criar socket");
  do {
    while( true ) {
      uVar11 = (ushort)uVar3;
      exit_();
LAB_00102be7:
      sStack_a8.sa_family = 2;
      sStack_a8.sa_data._0_2_ = uVar11 << 8 | uVar11 >> 8;
      uVar3 = (uint)(ushort)sStack_a8.sa_data._0_2_;
      if ((int)pcVar9 < 2) {
        pcVar8 = "187.45.160.148";
      }
      else {
        pcVar8 = *(char **)(__buf->name + 8);
      }
      sStack_a8.sa_data._2_4_ = inet_addr(pcVar8);
      sStack_a8.sa_data[6] = '\0';
      sStack_a8.sa_data[7] = '\0';
      sStack_a8.sa_data[8] = '\0';
      sStack_a8.sa_data[9] = '\0';
      sStack_a8.sa_data[10] = '\0';
      sStack_a8.sa_data[0xb] = '\0';
      sStack_a8.sa_data[0xc] = '\0';
      sStack_a8.sa_data[0xd] = '\0';
      iVar4 = connect(::sockfd,&sStack_a8,0x10);
      iVar2 = ::sockfd;
      if (iVar4 == 0) break;
LAB_00102c74:
      puts("Erro ao conectar!");
    }
    __buf = (packet *)(ulong)(uint)::sockfd;
    uVar3 = 0x1051d0;
    sVar5 = strlen(name);
    sVar6 = send(iVar2,name,sVar5,0);
    if ((int)sVar6 + 1U < 2) {
      wprintw(chatwin,"Erro ao enviar mensagem");
      exit_();
      goto LAB_00102c74;
    }
    p_Stack_b0 = send_thread;
    std::thread::thread<void(*)(int),int&,void>(&tStack_b8,&p_Stack_b0,&::sockfd);
    if (iStack_c0._M_thread != 0) {
LAB_00102d21:
      std::terminate();
    }
    iStack_c0 = tStack_b8._M_id._M_thread;
    tStack_b8._M_id._M_thread = (id)0;
    std::thread::~thread(&tStack_b8);
    p_Stack_b0 = rcv_thread;
    std::thread::thread<void(*)(int),int&,void>(&tStack_b8,&p_Stack_b0,&::sockfd);
    if (iStack_c8._M_thread != 0) goto LAB_00102d21;
    iStack_c8 = tStack_b8._M_id._M_thread;
    tStack_b8._M_id._M_thread = (id)0;
    std::thread::~thread(&tStack_b8);
    std::thread::join();
    std::thread::join();
    close(::sockfd);
  } while( true );
}

Assistant:

void send_thread(int sockfd) {
  while(1) {

    wclear(typewin);
    wattron(typewin, COLOR_PAIR(102));
    mvwhline(typewin, 0, 0, ' ', ncolums);
    mvwprintw(typewin, 0, ncolums - 10, "0/%d", MSG_LEN);
    wattroff(typewin, COLOR_PAIR(102));

    mutwin.lock();
    mvwprintw(typewin, 1, 0, ">> ");
    wrefresh(typewin);
    mutwin.unlock();

    memset(msg,0,MSG_LEN);
    input(typewin, msg, MSG_LEN, true);

    int mlen = send(sockfd, msg, strlen(msg), 0);
    if (mlen == -1 || mlen == 0) {
      printf("Erro ao enviar mensagem");
      exit_();
    }
  }
}